

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# unqlite.c
# Opt level: O2

int jx9Builtin_gmdate(jx9_context *pCtx,int nArg,jx9_value **apArg)

{
  char *zIn;
  tm *ptVar1;
  time_t t;
  int nLen;
  jx9_int64 local_78;
  int local_6c;
  Sytm local_68;
  
  if ((nArg < 1) || (((*apArg)->iFlags & 1) == 0)) {
    jx9_result_bool(pCtx,0);
    return 0;
  }
  zIn = jx9_value_to_string(*apArg,&local_6c);
  if (local_6c < 1) {
    jx9_result_string(pCtx,"",0);
  }
  if (nArg == 1) {
    time(&local_78);
  }
  else {
    if ((apArg[1]->iFlags & 2) != 0) {
      local_78 = jx9_value_to_int64(apArg[1]);
      ptVar1 = gmtime(&local_78);
      if (ptVar1 != (tm *)0x0) goto LAB_0012e686;
    }
    time(&local_78);
  }
LAB_0012e686:
  ptVar1 = gmtime(&local_78);
  local_68.tm_mon = ptVar1->tm_mon;
  local_68.tm_sec = ptVar1->tm_sec;
  local_68.tm_min = ptVar1->tm_min;
  local_68.tm_hour = ptVar1->tm_hour;
  local_68.tm_mday = ptVar1->tm_mday;
  local_68.tm_year = ptVar1->tm_year + 0x76c;
  local_68.tm_wday = ptVar1->tm_wday;
  local_68.tm_yday = ptVar1->tm_yday;
  local_68.tm_isdst = ptVar1->tm_isdst;
  local_68.tm_zone = (char *)0x0;
  local_68.tm_gmtoff = 0;
  DateFormat(pCtx,zIn,local_6c,&local_68);
  return 0;
}

Assistant:

static int jx9Builtin_gmdate(jx9_context *pCtx, int nArg, jx9_value **apArg)
{
	const char *zFormat;
	int nLen;
	Sytm sTm;
	if( nArg < 1 || !jx9_value_is_string(apArg[0]) ){
		/* Missing/Invalid argument, return FALSE */
		jx9_result_bool(pCtx, 0);
		return JX9_OK;
	}
	zFormat = jx9_value_to_string(apArg[0], &nLen);
	if( nLen < 1 ){
		/* Don't bother processing return the empty string */
		jx9_result_string(pCtx, "", 0);
	}
	if( nArg < 2 ){
#ifdef __WINNT__
		SYSTEMTIME sOS;
		GetSystemTime(&sOS);
		SYSTEMTIME_TO_SYTM(&sOS, &sTm);
#else
		struct tm *pTm;
		time_t t;
		time(&t);
		pTm = gmtime(&t);
		STRUCT_TM_TO_SYTM(pTm, &sTm);
#endif
	}else{
		/* Use the given timestamp */
		time_t t;
		struct tm *pTm;
		if( jx9_value_is_int(apArg[1]) ){
			t = (time_t)jx9_value_to_int64(apArg[1]);
			pTm = gmtime(&t);
			if( pTm == 0 ){
				time(&t);
			}
		}else{
			time(&t);
		}
		pTm = gmtime(&t);
		STRUCT_TM_TO_SYTM(pTm, &sTm);
	}
	/* Format the given string */
	DateFormat(pCtx, zFormat, nLen, &sTm);
	return JX9_OK;
}